

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O0

QSize __thiscall
QWindowsStyle::sizeFromContents
          (QWindowsStyle *this,ContentsType ct,QStyleOption *opt,QSize *csz,QWidget *widget)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  QStyleOptionButton *pQVar4;
  QStyleOptionMenuItem *pQVar5;
  ulong uVar6;
  QStyle *pQVar7;
  QChar c;
  QStyleOptionToolButton *pQVar8;
  QSize *pQVar9;
  QSize *in_RCX;
  QStyleOption *in_RDX;
  undefined4 in_ESI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  qreal dpi_00;
  qreal qVar10;
  QWidget *unaff_retaddr;
  QSize *in_stack_00000008;
  QStyleOption *in_stack_00000010;
  ContentsType in_stack_0000001c;
  QCommonStyle *in_stack_00000020;
  int checkcol;
  int tabSpacing;
  int iconExtent;
  int w_1;
  QStyleOptionMenuItem *mi;
  int minheight;
  int minwidth;
  qreal dpi;
  int defwidth;
  int h;
  int w;
  QStyleOptionButton *btn;
  QFontMetrics fmBold;
  QFontMetrics fm;
  int maxpmw;
  QSize sz;
  QFont fontBold;
  QStyleOption *in_stack_fffffffffffffec8;
  CaseSensitivity cs;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  QSize *in_stack_fffffffffffffee0;
  QIcon *pQVar11;
  int local_dc;
  int local_84;
  undefined1 *local_80;
  undefined1 *local_78;
  QChar local_6a;
  int local_68;
  undefined1 local_64 [8];
  undefined8 local_5c;
  int local_54;
  int local_50;
  QSize local_4c;
  QSize local_44;
  QSize local_3c;
  QFlagsStorageHelper<QStyleOptionButton::ButtonFeature,_4> local_34;
  QSize local_30;
  QSize local_28;
  QSize local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = *in_RCX;
  switch(in_ESI) {
  case 0:
    pQVar4 = qstyleoption_cast<QStyleOptionButton_const*>(in_RDX);
    if (pQVar4 != (QStyleOptionButton *)0x0) {
      local_30 = QCommonStyle::sizeFromContents
                           (in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
                            unaff_retaddr);
      local_28 = local_30;
      iVar2 = QSize::width((QSize *)0x4d652e);
      QSize::height((QSize *)0x4d653f);
      local_dc = 0;
      local_34.super_QFlagsStorage<QStyleOptionButton::ButtonFeature>.i =
           (QFlagsStorage<QStyleOptionButton::ButtonFeature>)
           QFlags<QStyleOptionButton::ButtonFeature>::operator&
                     ((QFlags<QStyleOptionButton::ButtonFeature> *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (ButtonFeature)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
      if (IVar3 != 0) {
        pQVar7 = QStyle::proxy((QStyle *)in_stack_fffffffffffffee0);
        local_dc = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,1,pQVar4,in_R8);
        local_dc = local_dc << 1;
      }
      dpi_00 = QStyleHelper::dpi(in_stack_fffffffffffffec8);
      qVar10 = QStyleHelper::dpiScaled(75.0,dpi_00);
      QStyleHelper::dpiScaled(23.0,dpi_00);
      if (iVar2 < (int)qVar10 + local_dc) {
        QString::isEmpty((QString *)0x4d6609);
      }
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8);
      local_28 = local_3c;
    }
    break;
  case 3:
    pQVar8 = qstyleoption_cast<QStyleOptionToolButton_const*>(in_RDX);
    if (pQVar8 != (QStyleOptionToolButton *)0x0) {
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8);
      pQVar9 = QSize::operator+=((QSize *)CONCAT44(in_stack_fffffffffffffed4,
                                                   in_stack_fffffffffffffed0),
                                 (QSize *)in_stack_fffffffffffffec8);
      local_20 = *pQVar9;
      goto LAB_004d6aeb;
    }
  default:
    local_28 = QCommonStyle::sizeFromContents
                         (in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
                          unaff_retaddr);
    break;
  case 7:
    pQVar5 = qstyleoption_cast<QStyleOptionMenuItem_const*>(in_RDX);
    if (pQVar5 != (QStyleOptionMenuItem *)0x0) {
      QSize::width((QSize *)0x4d668a);
      local_44 = QCommonStyle::sizeFromContents
                           (in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_00000008,
                            unaff_retaddr);
      local_28 = local_44;
      if (pQVar5->menuItemType == Separator) {
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8)
        ;
        local_28 = local_4c;
      }
      else {
        uVar6 = QIcon::isNull();
        if ((uVar6 & 1) != 0) {
          QSize::height((QSize *)0x4d671e);
          QSize::setHeight((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        }
      }
      if ((pQVar5->menuItemType != Separator) && (uVar6 = QIcon::isNull(), (uVar6 & 1) == 0)) {
        pQVar7 = QStyle::proxy((QStyle *)in_stack_fffffffffffffee0);
        (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x3e,in_RDX,in_R8);
        local_50 = QSize::height((QSize *)0x4d679b);
        pQVar11 = &pQVar5->icon;
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8)
        ;
        local_5c = QIcon::actualSize((QSize *)pQVar11,(Mode)local_64,On);
        local_54 = QSize::height((QSize *)0x4d67f3);
        local_54 = local_54 + 4;
        qMax<int>(&local_50,&local_54);
        QSize::setHeight((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      }
      cs = (CaseSensitivity)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      local_68 = pQVar5->maxIconWidth;
      c.ucs = (char16_t)((ulong)&pQVar5->text >> 0x30);
      QChar::QChar<char16_t,_true>(&local_6a,L'\t');
      bVar1 = QString::contains((QString *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),c,cs);
      if (((!bVar1) && (pQVar5->menuItemType != SubMenu)) && (pQVar5->menuItemType == DefaultItem))
      {
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_78,&pQVar5->font);
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QFont::QFont((QFont *)&local_18,&pQVar5->font);
        QFont::setBold((QFont *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       SUB41(cs >> 0x18,0));
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_80,(QFont *)&local_18);
        in_stack_fffffffffffffed4 =
             QFontMetrics::horizontalAdvance((QString *)&local_80,(int)pQVar5 + 0x60);
        QFontMetrics::horizontalAdvance((QString *)&local_78,(int)pQVar5 + 0x60);
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_80);
        QFont::~QFont((QFont *)&local_18);
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_78);
      }
      local_84 = 0xc;
      qMax<int>(&local_68,&local_84);
      QSize::setWidth((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),cs);
    }
    break;
  case 8:
    bVar1 = QSize::isEmpty(in_stack_fffffffffffffee0);
    if (!bVar1) {
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8);
      QSize::operator+=((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        (QSize *)in_stack_fffffffffffffec8);
    }
  }
  local_20 = local_28;
LAB_004d6aeb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QSize QWindowsStyle::sizeFromContents(ContentsType ct, const QStyleOption *opt,
                                      const QSize &csz, const QWidget *widget) const
{
    QSize sz(csz);
    switch (ct) {
    case CT_PushButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);
            int w = sz.width(),
                h = sz.height();
            int defwidth = 0;
            if (btn->features & QStyleOptionButton::AutoDefaultButton)
                defwidth = 2 * proxy()->pixelMetric(PM_ButtonDefaultIndicator, btn, widget);
            const qreal dpi = QStyleHelper::dpi(opt);
            int minwidth = int(QStyleHelper::dpiScaled(75, dpi));
            int minheight = int(QStyleHelper::dpiScaled(23, dpi));

            if (w < minwidth + defwidth && !btn->text.isEmpty())
                w = minwidth + defwidth;
            if (h < minheight + defwidth)
                h = minheight + defwidth;

            sz = QSize(w, h);
        }
        break;
#if QT_CONFIG(menu)
    case CT_MenuItem:
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            int w = sz.width();
            sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);

            if (mi->menuItemType == QStyleOptionMenuItem::Separator) {
                sz = QSize(10, QWindowsStylePrivate::windowsSepHeight);
            }
            else if (mi->icon.isNull()) {
                sz.setHeight(sz.height() - 2);
                w -= 6;
            }

            if (mi->menuItemType != QStyleOptionMenuItem::Separator && !mi->icon.isNull()) {
                int iconExtent = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
                sz.setHeight(qMax(sz.height(),
                                  mi->icon.actualSize(QSize(iconExtent, iconExtent)).height()
                                  + 2 * QWindowsStylePrivate::windowsItemFrame));
            }
            int maxpmw = mi->maxIconWidth;
            int tabSpacing = 20;
            if (mi->text.contains(u'\t'))
                w += tabSpacing;
            else if (mi->menuItemType == QStyleOptionMenuItem::SubMenu)
                w += 2 * QWindowsStylePrivate::windowsArrowHMargin;
            else if (mi->menuItemType == QStyleOptionMenuItem::DefaultItem) {
                // adjust the font and add the difference in size.
                // it would be better if the font could be adjusted in the initStyleOption qmenu func!!
                QFontMetrics fm(mi->font);
                QFont fontBold = mi->font;
                fontBold.setBold(true);
                QFontMetrics fmBold(fontBold);
                w += fmBold.horizontalAdvance(mi->text) - fm.horizontalAdvance(mi->text);
            }

            int checkcol = qMax<int>(maxpmw, QWindowsStylePrivate::windowsCheckMarkWidth); // Windows always shows a check column
            w += checkcol;
            w += int(QWindowsStylePrivate::windowsRightBorder) + 10;
            sz.setWidth(w);
        }
        break;
#endif // QT_CONFIG(menu)
#if QT_CONFIG(menubar)
    case CT_MenuBarItem:
        if (!sz.isEmpty())
            sz += QSize(QWindowsStylePrivate::windowsItemHMargin * 4, QWindowsStylePrivate::windowsItemVMargin * 2);
        break;
#endif
    case CT_ToolButton:
        if (qstyleoption_cast<const QStyleOptionToolButton *>(opt))
            return sz += QSize(7, 6);
        Q_FALLTHROUGH();

    default:
        sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);
    }
    return sz;
}